

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

Recycler * __thiscall ThreadContext::EnsureRecycler(ThreadContext *this)

{
  bool bVar1;
  HeapAllocator *alloc;
  Recycler *pRVar2;
  AllocationPolicyManager *policyManager;
  RecyclableData *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount> *pDVar4;
  undefined1 local_130 [8];
  StressTester test;
  AutoRecyclerPtr recyclerToDelete;
  TrackAllocData local_108;
  code *local_e0;
  undefined8 local_d8;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_50;
  undefined8 local_48;
  TrackAllocData local_40;
  BasePtr<Memory::Recycler> local_18;
  AutoRecyclerPtr newRecycler;
  ThreadContext *this_local;
  
  newRecycler.super_AutoPtr<Memory::Recycler,_Memory::HeapAllocator>.super_BasePtr<Memory::Recycler>
  .ptr = (AutoPtr<Memory::Recycler,_Memory::HeapAllocator>)
         (AutoPtr<Memory::Recycler,_Memory::HeapAllocator>)this;
  if (this->recycler == (Recycler *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&Memory::Recycler::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0x2d1);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
    local_50 = Memory::HeapAllocator::Alloc;
    local_48 = 0;
    pRVar2 = (Recycler *)new<Memory::HeapAllocator>(0x166e0,alloc,0x350bd0);
    policyManager = GetAllocationPolicyManager(this);
    Memory::Recycler::Recycler
              (pRVar2,policyManager,&this->pageAllocator,Js::Throw::OutOfMemory,
               (ConfigFlagsTable *)&Js::Configuration::Global,
               &(this->recyclerTelemetryHostInterface).super_RecyclerTelemetryHostInterface);
    AutoRecyclerPtr::AutoRecyclerPtr((AutoRecyclerPtr *)&local_18,pRVar2);
    pRVar2 = BasePtr<Memory::Recycler>::operator->(&local_18);
    Memory::Recycler::Initialize
              (pRVar2,(bool)(this->isOptimizedForManyInstances & 1),&this->threadService,false,
               PageHeapModeOff,false,false);
    pRVar2 = BasePtr<Memory::Recycler>::operator->(&local_18);
    Memory::Recycler::SetCollectionWrapper(pRVar2,(RecyclerCollectionWrapper *)this);
    pRVar2 = BasePtr::operator_cast_to_Recycler_((BasePtr *)&local_18);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_98,(type_info *)&RecyclableData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0x2e1);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_98);
    local_a8 = Memory::Recycler::AllocZeroInlined;
    local_a0 = 0;
    this_00 = (RecyclableData *)new<Memory::Recycler>(0x240,pRVar2,0x744a10);
    pRVar2 = BasePtr::operator_cast_to_Recycler_((BasePtr *)&local_18);
    RecyclableData::RecyclableData(this_00,pRVar2);
    pRVar2 = BasePtr::operator_cast_to_Recycler_((BasePtr *)&local_18);
    Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::Root
              (&this->recyclableData,this_00,pRVar2);
    bVar1 = IsThreadBound(this);
    if (bVar1) {
      pRVar2 = BasePtr<Memory::Recycler>::operator->(&local_18);
      Memory::Recycler::SetIsThreadBound(pRVar2);
    }
    pRVar2 = BasePtr<Memory::Recycler>::Detach(&local_18);
    this->recycler = pRVar2;
    bVar1 = Memory::RecyclerWriteBarrierManager::OnThreadInit();
    if (!bVar1) {
      Js::Throw::OutOfMemory();
    }
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d0,
               (type_info *)&DList<ExpirableObject*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0x2f8);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&(this->threadAlloc).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_d0);
    local_e0 = Memory::ArenaAllocator::Alloc;
    local_d8 = 0;
    pDVar4 = (DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount> *)
             new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar3,0x3f67b0);
    DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount>::DList(pDVar4,&this->threadAlloc);
    this->expirableObjectList = pDVar4;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_108,
               (type_info *)&DList<ExpirableObject*,Memory::ArenaAllocator,RealCount>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0x2f9);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(&(this->threadAlloc).
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,&local_108);
    pDVar4 = (DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount> *)
             new<Memory::ArenaAllocator>(0x20,(ArenaAllocator *)pAVar3,0x3f67b0);
    DList<ExpirableObject_*,_Memory::ArenaAllocator,_RealCount>::DList(pDVar4,&this->threadAlloc);
    this->expirableObjectDisposeList = pDVar4;
    InitializePropertyMaps(this);
    AutoRecyclerPtr::~AutoRecyclerPtr((AutoRecyclerPtr *)&local_18);
  }
  if ((DAT_01ebe7a4 & 1) != 0) {
    StressTester::StressTester((StressTester *)local_130,this->recycler);
    StressTester::Run((StressTester *)local_130);
  }
  return this->recycler;
}

Assistant:

Recycler* ThreadContext::EnsureRecycler()
{
    if (recycler == NULL)
    {
        AutoRecyclerPtr newRecycler(HeapNew(Recycler, GetAllocationPolicyManager(), &pageAllocator, Js::Throw::OutOfMemory, Js::Configuration::Global.flags, &recyclerTelemetryHostInterface));
        newRecycler->Initialize(isOptimizedForManyInstances, &threadService); // use in-thread GC when optimizing for many instances
        newRecycler->SetCollectionWrapper(this);

#if ENABLE_NATIVE_CODEGEN
        // This may throw, so it needs to be after the recycler is initialized,
        // otherwise, the recycler dtor may encounter problems
#if !FLOATVAR
        // TODO: we only need one of the following, one for OOP jit and one for in-proc BG JIT
        AutoPtr<CodeGenNumberThreadAllocator> localCodeGenNumberThreadAllocator(
            HeapNew(CodeGenNumberThreadAllocator, newRecycler));
        AutoPtr<XProcNumberPageSegmentManager> localXProcNumberPageSegmentManager(
            HeapNew(XProcNumberPageSegmentManager, newRecycler));
#endif
#endif

        this->recyclableData.Root(RecyclerNewZ(newRecycler, RecyclableData, newRecycler), newRecycler);

        if (this->IsThreadBound())
        {
            newRecycler->SetIsThreadBound();
        }

        // Assign the recycler to the ThreadContext after everything is initialized, because an OOM during initialization would
        // result in only partial initialization, so the 'recycler' member variable should remain null to cause full
        // reinitialization when requested later. Anything that happens after the Detach must have special cleanup code.
        this->recycler = newRecycler.Detach();

        try
        {
#ifdef RECYCLER_WRITE_BARRIER
#ifdef TARGET_64
            if (!RecyclerWriteBarrierManager::OnThreadInit())
            {
                Js::Throw::OutOfMemory();
            }
#endif
#endif

            this->expirableObjectList = Anew(&this->threadAlloc, ExpirableObjectList, &this->threadAlloc);
            this->expirableObjectDisposeList = Anew(&this->threadAlloc, ExpirableObjectList, &this->threadAlloc);

            InitializePropertyMaps(); // has many dependencies on the recycler and other members of the thread context
#if ENABLE_NATIVE_CODEGEN
#if !FLOATVAR
            this->codeGenNumberThreadAllocator = localCodeGenNumberThreadAllocator.Detach();
            this->xProcNumberPageSegmentManager = localXProcNumberPageSegmentManager.Detach();
#endif
#endif
        }
        catch(...)
        {
            // Initialization failed, undo what was done above. Callees that throw must clean up after themselves.
            if (this->recyclableData != nullptr)
            {
                this->recyclableData.Unroot(this->recycler);
            }

            {
                // AutoRecyclerPtr's destructor takes care of shutting down the background thread and deleting the recycler
                AutoRecyclerPtr recyclerToDelete(this->recycler);
                this->recycler = nullptr;
            }

            throw;
        }

        JS_ETW(EventWriteJSCRIPT_GC_INIT(this->recycler, this->GetHiResTimer()->Now()));
    }

#if DBG
    if (CONFIG_FLAG(RecyclerTest))
    {
        StressTester test(recycler);
        test.Run();
    }
#endif

    return recycler;
}